

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

FloatParts uint_to_float(uint64_t a,int scale,float_status *status)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  FloatParts FVar6;
  
  if (a != 0) {
    iVar3 = -0x10000;
    if (-0x10000 < scale) {
      iVar3 = scale;
    }
    if (0xffff < iVar3) {
      iVar3 = 0x10000;
    }
    if ((long)a < 0) {
      uVar4 = iVar3 + 0x3f;
      uVar2 = (ulong)((uint)a & 1) | a >> 1;
    }
    else {
      lVar1 = 0x3f;
      if (a != 0) {
        for (; a >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar4 = iVar3 + (int)lVar1;
      uVar2 = a << (((byte)lVar1 ^ 0x3f) - 1 & 0x3f);
    }
    uVar5 = (ulong)uVar4 | 0x200000000;
    FVar6.exp = (int)uVar5;
    FVar6.cls = (char)(uVar5 >> 0x20);
    FVar6.sign = (_Bool)(char)(uVar5 >> 0x28);
    FVar6._14_2_ = (short)(uVar5 >> 0x30);
    FVar6.frac = uVar2;
    return FVar6;
  }
  return (FloatParts)(ZEXT816(0x100000000) << 0x40);
}

Assistant:

static FloatParts uint_to_float(uint64_t a, int scale, float_status *status)
{
    FloatParts r = { .sign = false };

    if (a == 0) {
        r.cls = float_class_zero;
    } else {
        scale = MIN(MAX(scale, -0x10000), 0x10000);
        r.cls = float_class_normal;
        if ((int64_t)a < 0) {
            r.exp = DECOMPOSED_BINARY_POINT + 1 + scale;
            shift64RightJamming(a, 1, &a);
            r.frac = a;
        } else {
            int shift = clz64(a) - 1;
            r.exp = DECOMPOSED_BINARY_POINT - shift + scale;
            r.frac = a << shift;
        }
    }

    return r;
}